

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

MaybeResult<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_> *
wasm::WATParser::params<wasm::WATParser::ParseImplicitTypeDefsCtx>
          (MaybeResult<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_>
           *__return_storage_ptr__,ParseImplicitTypeDefsCtx *ctx,bool allowNames)

{
  string_view id_00;
  undefined8 pos_00;
  bool bVar1;
  Name *pNVar2;
  Type *pTVar3;
  basic_string_view<char,_std::char_traits<char>_> expected;
  string_view local_228;
  Err local_218;
  Err *local_1f8;
  Err *err_1;
  Result<wasm::Type> _val_1;
  Result<wasm::Type> type_1;
  allocator<char> local_179;
  string local_178;
  Err local_158;
  Err local_138;
  Err *local_118;
  Err *err;
  Result<wasm::Type> _val;
  Result<wasm::Type> type;
  string local_b8;
  Err local_98;
  undefined1 local_78 [8];
  optional<wasm::Name> id;
  size_t pos;
  undefined1 local_38 [8];
  ParamsT res;
  bool hasAny;
  bool allowNames_local;
  ParseImplicitTypeDefsCtx *ctx_local;
  
  res.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  res.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = allowNames;
  TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::makeParams
            ((ParamsT *)local_38,
             &ctx->super_TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>);
  do {
    while( true ) {
      expected = sv("param",5);
      bVar1 = Lexer::takeSExprStart(&ctx->in,expected);
      if (!bVar1) {
        if ((res.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._6_1_ & 1) == 0) {
          MaybeResult<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_>::MaybeResult
                    (__return_storage_ptr__);
          type.val.super__Variant_base<wasm::Type,_wasm::Err>.
          super__Move_assign_alias<wasm::Type,_wasm::Err>.
          super__Copy_assign_alias<wasm::Type,_wasm::Err>.
          super__Move_ctor_alias<wasm::Type,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
          super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_index = '\x01';
          type.val.super__Variant_base<wasm::Type,_wasm::Err>.
          super__Move_assign_alias<wasm::Type,_wasm::Err>.
          super__Copy_assign_alias<wasm::Type,_wasm::Err>.
          super__Move_ctor_alias<wasm::Type,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
          super__Variant_storage_alias<wasm::Type,_wasm::Err>._33_3_ = 0;
        }
        else {
          MaybeResult<std::vector<wasm::NameType,std::allocator<wasm::NameType>>>::
          MaybeResult<std::vector<wasm::NameType,std::allocator<wasm::NameType>>>
                    ((MaybeResult<std::vector<wasm::NameType,std::allocator<wasm::NameType>>> *)
                     __return_storage_ptr__,
                     (vector<wasm::NameType,_std::allocator<wasm::NameType>_> *)local_38);
          type.val.super__Variant_base<wasm::Type,_wasm::Err>.
          super__Move_assign_alias<wasm::Type,_wasm::Err>.
          super__Copy_assign_alias<wasm::Type,_wasm::Err>.
          super__Move_ctor_alias<wasm::Type,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
          super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_index = '\x01';
          type.val.super__Variant_base<wasm::Type,_wasm::Err>.
          super__Move_assign_alias<wasm::Type,_wasm::Err>.
          super__Copy_assign_alias<wasm::Type,_wasm::Err>.
          super__Move_ctor_alias<wasm::Type,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
          super__Variant_storage_alias<wasm::Type,_wasm::Err>._33_3_ = 0;
        }
        goto LAB_0240cfb5;
      }
      res.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
      id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Name>._16_8_ = Lexer::getPos(&ctx->in);
      Lexer::takeID((optional<wasm::Name> *)local_78,&ctx->in);
      bVar1 = std::optional::operator_cast_to_bool((optional *)local_78);
      pos_00 = id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Name>._16_8_;
      if (bVar1) break;
      while (bVar1 = Lexer::takeRParen(&ctx->in), ((bVar1 ^ 0xffU) & 1) != 0) {
        valtype<wasm::WATParser::ParseImplicitTypeDefsCtx>
                  ((Result<wasm::Type> *)
                   ((long)&_val_1.val.super__Variant_base<wasm::Type,_wasm::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20),ctx);
        Result<wasm::Type>::Result
                  ((Result<wasm::Type> *)&err_1,
                   (Result<wasm::Type> *)
                   ((long)&_val_1.val.super__Variant_base<wasm::Type,_wasm::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
        local_1f8 = Result<wasm::Type>::getErr((Result<wasm::Type> *)&err_1);
        bVar1 = local_1f8 != (Err *)0x0;
        if (bVar1) {
          wasm::Err::Err(&local_218,local_1f8);
          MaybeResult<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_>::MaybeResult
                    (__return_storage_ptr__,&local_218);
          wasm::Err::~Err(&local_218);
        }
        type.val.super__Variant_base<wasm::Type,_wasm::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::Err>.super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::Err>._33_3_ = 0;
        type.val.super__Variant_base<wasm::Type,_wasm::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::Err>.super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_index = bVar1;
        Result<wasm::Type>::~Result((Result<wasm::Type> *)&err_1);
        if (type.val.super__Variant_base<wasm::Type,_wasm::Err>.
            super__Move_assign_alias<wasm::Type,_wasm::Err>.
            super__Copy_assign_alias<wasm::Type,_wasm::Err>.
            super__Move_ctor_alias<wasm::Type,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
            super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_4_ == 0) {
          wasm::Name::Name((Name *)&local_228);
          pTVar3 = Result<wasm::Type>::operator*
                             ((Result<wasm::Type> *)
                              ((long)&_val_1.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                      super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
          TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::appendParam
                    (&ctx->super_TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>,
                     (ParamsT *)local_38,(Name)local_228,(TypeT)pTVar3->id);
          type.val.super__Variant_base<wasm::Type,_wasm::Err>.
          super__Move_assign_alias<wasm::Type,_wasm::Err>.
          super__Copy_assign_alias<wasm::Type,_wasm::Err>.
          super__Move_ctor_alias<wasm::Type,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
          super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_index = '\0';
          type.val.super__Variant_base<wasm::Type,_wasm::Err>.
          super__Move_assign_alias<wasm::Type,_wasm::Err>.
          super__Copy_assign_alias<wasm::Type,_wasm::Err>.
          super__Move_ctor_alias<wasm::Type,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
          super__Variant_storage_alias<wasm::Type,_wasm::Err>._33_3_ = 0;
        }
        Result<wasm::Type>::~Result
                  ((Result<wasm::Type> *)
                   ((long)&_val_1.val.super__Variant_base<wasm::Type,_wasm::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
        if (type.val.super__Variant_base<wasm::Type,_wasm::Err>.
            super__Move_assign_alias<wasm::Type,_wasm::Err>.
            super__Copy_assign_alias<wasm::Type,_wasm::Err>.
            super__Move_ctor_alias<wasm::Type,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
            super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_4_ != 0) goto LAB_0240cfb5;
      }
    }
    if ((res.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"unexpected named parameter",
                 (allocator<char> *)
                 ((long)&type.val.super__Variant_base<wasm::Type,_wasm::Err>.
                         super__Move_assign_alias<wasm::Type,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x27));
      Lexer::err(&local_98,&ctx->in,pos_00,&local_b8);
      MaybeResult<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_>::MaybeResult
                (__return_storage_ptr__,&local_98);
      wasm::Err::~Err(&local_98);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&type.val.super__Variant_base<wasm::Type,_wasm::Err>.
                         super__Move_assign_alias<wasm::Type,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x27));
      type.val.super__Variant_base<wasm::Type,_wasm::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::Err>.super__Move_ctor_alias<wasm::Type,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_index = '\x01';
      type.val.super__Variant_base<wasm::Type,_wasm::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::Err>.super__Move_ctor_alias<wasm::Type,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::Err>._33_3_ = 0;
      break;
    }
    valtype<wasm::WATParser::ParseImplicitTypeDefsCtx>
              ((Result<wasm::Type> *)
               ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                       super__Move_assign_alias<wasm::Type,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20),ctx);
    Result<wasm::Type>::Result
              ((Result<wasm::Type> *)&err,
               (Result<wasm::Type> *)
               ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                       super__Move_assign_alias<wasm::Type,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
    local_118 = Result<wasm::Type>::getErr((Result<wasm::Type> *)&err);
    bVar1 = local_118 != (Err *)0x0;
    if (bVar1) {
      wasm::Err::Err(&local_138,local_118);
      MaybeResult<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_>::MaybeResult
                (__return_storage_ptr__,&local_138);
      wasm::Err::~Err(&local_138);
    }
    type.val.super__Variant_base<wasm::Type,_wasm::Err>.
    super__Move_assign_alias<wasm::Type,_wasm::Err>.super__Copy_assign_alias<wasm::Type,_wasm::Err>.
    super__Move_ctor_alias<wasm::Type,_wasm::Err>.super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
    super__Variant_storage_alias<wasm::Type,_wasm::Err>._33_3_ = 0;
    type.val.super__Variant_base<wasm::Type,_wasm::Err>.
    super__Move_assign_alias<wasm::Type,_wasm::Err>.super__Copy_assign_alias<wasm::Type,_wasm::Err>.
    super__Move_ctor_alias<wasm::Type,_wasm::Err>.super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
    super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_index = bVar1;
    Result<wasm::Type>::~Result((Result<wasm::Type> *)&err);
    if (type.val.super__Variant_base<wasm::Type,_wasm::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::Err>.super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_4_ == 0) {
      bVar1 = Lexer::takeRParen(&ctx->in);
      if (bVar1) {
        pNVar2 = std::optional<wasm::Name>::operator*((optional<wasm::Name> *)local_78);
        id_00 = (pNVar2->super_IString).str;
        pTVar3 = Result<wasm::Type>::operator*
                           ((Result<wasm::Type> *)
                            ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
        TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::appendParam
                  (&ctx->super_TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>,
                   (ParamsT *)local_38,(Name)id_00,(TypeT)pTVar3->id);
        type.val.super__Variant_base<wasm::Type,_wasm::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::Err>.super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_index = '\0';
        type.val.super__Variant_base<wasm::Type,_wasm::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::Err>.super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::Err>._33_3_ = 0;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_178,"expected end of param",&local_179);
        Lexer::err(&local_158,&ctx->in,&local_178);
        MaybeResult<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_>::MaybeResult
                  (__return_storage_ptr__,&local_158);
        wasm::Err::~Err(&local_158);
        std::__cxx11::string::~string((string *)&local_178);
        std::allocator<char>::~allocator(&local_179);
        type.val.super__Variant_base<wasm::Type,_wasm::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::Err>.super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_index = '\x01';
        type.val.super__Variant_base<wasm::Type,_wasm::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::Err>.super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::Err>._33_3_ = 0;
      }
    }
    Result<wasm::Type>::~Result
              ((Result<wasm::Type> *)
               ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                       super__Move_assign_alias<wasm::Type,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
  } while (type.val.super__Variant_base<wasm::Type,_wasm::Err>.
           super__Move_assign_alias<wasm::Type,_wasm::Err>.
           super__Copy_assign_alias<wasm::Type,_wasm::Err>.
           super__Move_ctor_alias<wasm::Type,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
           super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_4_ == 0);
LAB_0240cfb5:
  std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>::~vector
            ((vector<wasm::NameType,_std::allocator<wasm::NameType>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<typename Ctx::ParamsT> params(Ctx& ctx, bool allowNames) {
  bool hasAny = false;
  auto res = ctx.makeParams();
  while (ctx.in.takeSExprStart("param"sv)) {
    hasAny = true;
    auto pos = ctx.in.getPos();
    if (auto id = ctx.in.takeID()) {
      // Single named param
      if (!allowNames) {
        return ctx.in.err(pos, "unexpected named parameter");
      }
      auto type = valtype(ctx);
      CHECK_ERR(type);
      if (!ctx.in.takeRParen()) {
        return ctx.in.err("expected end of param");
      }
      ctx.appendParam(res, *id, *type);
    } else {
      // Repeated unnamed params
      while (!ctx.in.takeRParen()) {
        auto type = valtype(ctx);
        CHECK_ERR(type);
        ctx.appendParam(res, {}, *type);
      }
    }
  }
  if (hasAny) {
    return res;
  }
  return {};
}